

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-test.c
# Opt level: O2

void event_print(telnet_t *telnet,telnet_event_t *ev,void *ud)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *format;
  size_t sVar7;
  long lVar8;
  
  switch(ev->type) {
  case TELNET_EV_DATA:
    stprintf((state_t *)ud,"DATA [%zi] ==> ",(ev->data).size);
    print_encode((state_t *)ud,(ev->data).buffer,(ev->data).size);
    goto LAB_0010167d;
  default:
    return;
  case TELNET_EV_IAC:
    bVar1 = (ev->iac).cmd;
    uVar3 = (ulong)bVar1;
    if (bVar1 < 0xec) {
      pcVar6 = (char *)&get_cmd_buffer;
      snprintf((char *)&get_cmd_buffer,4,"%d",(ulong)(uint)bVar1);
    }
    else {
      pcVar6 = &DAT_001051f4 +
               *(int *)("Usage: telnet-test [test file] [expected outline]\n" +
                       (long)(char)bVar1 * 4);
    }
    pcVar5 = "IAC %d (%s)\n";
    goto LAB_001018b9;
  case TELNET_EV_WILL:
    uVar4 = (ev->neg).telopt_extended;
    pcVar6 = get_opt(uVar4);
    pcVar5 = "WILL %d (%s)\n";
    break;
  case TELNET_EV_WONT:
    uVar4 = (ev->neg).telopt_extended;
    pcVar6 = get_opt(uVar4);
    pcVar5 = "WONT %d (%s)\n";
    break;
  case TELNET_EV_DO:
    uVar4 = (ev->neg).telopt_extended;
    pcVar6 = get_opt(uVar4);
    pcVar5 = "DO %d (%s)\n";
    break;
  case TELNET_EV_DONT:
    uVar4 = (ev->neg).telopt_extended;
    pcVar6 = get_opt(uVar4);
    pcVar5 = "DONT %d (%s)\n";
    break;
  case TELNET_EV_SUBNEGOTIATION:
    uVar4 = (ev->sub).telopt_extended;
    if ((uVar4 - 0x24 < 0x3a) && ((0x200000400000009U >> ((ulong)(uVar4 - 0x24) & 0x3f) & 1) != 0))
    {
      return;
    }
    if (uVar4 == 0x18) {
      return;
    }
    if (uVar4 == 0xff) {
      return;
    }
    pcVar6 = get_opt(uVar4);
    stprintf((state_t *)ud,"SUB %d (%s) [%zi]\n",(ulong)uVar4,pcVar6,(ev->data).size);
    return;
  case TELNET_EV_COMPRESS:
    pcVar6 = "ON";
    if ((ev->iac).cmd == '\0') {
      pcVar6 = "OFF";
    }
    pcVar5 = "COMPRESSION %s\n";
    goto LAB_0010194a;
  case TELNET_EV_ZMP:
    pcVar5 = (char *)(ev->data).size;
    pcVar6 = *(ev->zmp).argv;
    format = "ZMP (%s) [%zi]\n";
    goto LAB_001019a6;
  case TELNET_EV_TTYPE:
    pcVar6 = "SEND";
    if ((ev->iac).cmd == '\0') {
      pcVar6 = "IS";
    }
    pcVar5 = "";
    if ((ev->data).buffer != (char *)0x0) {
      pcVar5 = (ev->data).buffer;
    }
    format = "TTYPE %s %s\n";
LAB_001019a6:
    stprintf((state_t *)ud,format,pcVar6,pcVar5);
    return;
  case TELNET_EV_ENVIRON:
    pcVar6 = "INFO";
    if ((ev->environ).cmd == '\x01') {
      pcVar6 = "SEND";
    }
    pcVar5 = "IS";
    if ((ev->environ).cmd != '\0') {
      pcVar5 = pcVar6;
    }
    stprintf((state_t *)ud,"ENVIRON [%zi parts] ==> %s",(ev->data).size,pcVar5);
    lVar8 = 0;
    for (sVar7 = 0; sVar7 != (ev->data).size; sVar7 = sVar7 + 1) {
      pcVar6 = "USERVAR";
      if ((ev->data).buffer[lVar8] == '\0') {
        pcVar6 = "VAR";
      }
      stprintf((state_t *)ud," %s \"",pcVar6);
      pcVar6 = *(char **)((long)&((ev->environ).values)->var + lVar8);
      if (pcVar6 != (char *)0x0) {
        sVar2 = strlen(pcVar6);
        print_encode((state_t *)ud,pcVar6,sVar2);
      }
      stprintf((state_t *)ud,"\"");
      if ((ev->environ).cmd != '\x01') {
        stprintf((state_t *)ud,"=\"");
        pcVar6 = *(char **)((long)&((ev->environ).values)->value + lVar8);
        if (pcVar6 != (char *)0x0) {
          sVar2 = strlen(pcVar6);
          print_encode((state_t *)ud,pcVar6,sVar2);
        }
        stprintf((state_t *)ud,"\"");
      }
      lVar8 = lVar8 + 0x18;
    }
    goto LAB_0010167d;
  case TELNET_EV_MSSP:
    stprintf((state_t *)ud,"MSSP [%zi] ==>",(ev->data).size);
    lVar8 = 0;
    for (sVar7 = 0; sVar7 != (ev->data).size; sVar7 = sVar7 + 1) {
      stprintf((state_t *)ud," \"");
      pcVar6 = *(char **)((long)&((ev->environ).values)->var + lVar8);
      sVar2 = strlen(pcVar6);
      print_encode((state_t *)ud,pcVar6,sVar2);
      stprintf((state_t *)ud,"\"=\"");
      pcVar6 = *(char **)((long)&((ev->environ).values)->value + lVar8);
      sVar2 = strlen(pcVar6);
      print_encode((state_t *)ud,pcVar6,sVar2);
      stprintf((state_t *)ud,"\"");
      lVar8 = lVar8 + 0x18;
    }
LAB_0010167d:
    stprintf((state_t *)ud,"\n");
    return;
  case TELNET_EV_WARNING:
    pcVar6 = (ev->error).msg;
    pcVar5 = "WARNING: %s\n";
    goto LAB_0010194a;
  case TELNET_EV_ERROR:
    pcVar6 = (ev->error).msg;
    pcVar5 = "ERROR: %s\n";
LAB_0010194a:
    stprintf((state_t *)ud,pcVar5,pcVar6);
    return;
  }
  uVar3 = (ulong)uVar4;
LAB_001018b9:
  stprintf((state_t *)ud,pcVar5,uVar3,pcVar6);
  return;
}

Assistant:

static void event_print(telnet_t *telnet, telnet_event_t *ev, void *ud) {
	size_t i;
	state_t *state;

	(void)telnet;

	state = (state_t *)ud;

	switch (ev->type) {
	case TELNET_EV_DATA:
		stprintf(state, "DATA [%zi] ==> ", ev->data.size);
		print_encode(state, ev->data.buffer, ev->data.size);
		stprintf(state, "\n");
		break;
	case TELNET_EV_SEND:
		break;
	case TELNET_EV_IAC:
		stprintf(state, "IAC %d (%s)\n", (int)ev->iac.cmd, get_cmd(ev->iac.cmd));
		break;
	case TELNET_EV_WILL:
		stprintf(state, "WILL %d (%s)\n", (int)ev->neg.telopt_extended, get_opt(ev->neg.telopt_extended));
		break;
	case TELNET_EV_WONT:
		stprintf(state, "WONT %d (%s)\n", (int)ev->neg.telopt_extended, get_opt(ev->neg.telopt_extended));
		break;
	case TELNET_EV_DO:
		stprintf(state, "DO %d (%s)\n", (int)ev->neg.telopt_extended, get_opt(ev->neg.telopt_extended));
		break;
	case TELNET_EV_DONT:
		stprintf(state, "DONT %d (%s)\n", (int)ev->neg.telopt_extended, get_opt(ev->neg.telopt_extended));
		break;
	case TELNET_EV_SUBNEGOTIATION:
		switch (ev->sub.telopt_extended) {
		case TELNET_TELOPT_ENVIRON:
		case TELNET_TELOPT_NEW_ENVIRON:
		case TELNET_TELOPT_TTYPE:
		case TELNET_TELOPT_ZMP:
		case TELNET_TELOPT_MSSP:
		case TELNET_TELOPT_EXOPL:
			/* print nothing */
			break;
		default:
			stprintf(state, "SUB %d (%s) [%zi]\n", (int)ev->sub.telopt_extended, get_opt(ev->sub.telopt_extended), ev->sub.size);
			break;
		}
		break;
	case TELNET_EV_ZMP:
		stprintf(state, "ZMP (%s) [%zi]\n", ev->zmp.argv[0], ev->zmp.argc);
		break;
	case TELNET_EV_TTYPE:
		stprintf(state, "TTYPE %s %s\n", ev->ttype.cmd ? "SEND" : "IS",
				ev->ttype.name ? ev->ttype.name : "");
		break;
	/* ENVIRON/NEW-ENVIRON commands */
	case TELNET_EV_ENVIRON:
		stprintf(state, "ENVIRON [%zi parts] ==> %s", ev->environ.size, ev->environ.cmd == TELNET_ENVIRON_IS ? "IS" : (ev->environ.cmd == TELNET_ENVIRON_SEND ? "SEND" : "INFO"));
		for (i = 0; i != ev->environ.size; ++i) {
			stprintf(state, " %s \"", ev->environ.values[i].type == TELNET_ENVIRON_VAR ? "VAR" : "USERVAR");
			if (ev->environ.values[i].var != 0) {
				print_encode(state, ev->environ.values[i].var, strlen(ev->environ.values[i].var));
			}
			stprintf(state, "\"");
			if (ev->environ.cmd != TELNET_ENVIRON_SEND) {
				stprintf(state, "=\"");
				if (ev->environ.values[i].value != 0) {
					print_encode(state, ev->environ.values[i].value, strlen(ev->environ.values[i].value));
				}
				stprintf(state, "\"");
			}
		}
		stprintf(state, "\n");
		break;
	case TELNET_EV_MSSP:
		stprintf(state, "MSSP [%zi] ==>", ev->mssp.size);
		for (i = 0; i != ev->mssp.size; ++i) {
			stprintf(state, " \"");
			print_encode(state, ev->mssp.values[i].var, strlen(ev->mssp.values[i].var));
			stprintf(state, "\"=\"");
			print_encode(state, ev->mssp.values[i].value, strlen(ev->mssp.values[i].value));
			stprintf(state, "\"");
		}
		stprintf(state, "\n");
		break;
	case TELNET_EV_COMPRESS:
		stprintf(state, "COMPRESSION %s\n", ev->compress.state ? "ON" : "OFF");
		break;
	case TELNET_EV_WARNING:
		stprintf(state, "WARNING: %s\n", ev->error.msg);
		break;
	case TELNET_EV_ERROR:
		stprintf(state, "ERROR: %s\n", ev->error.msg);
		break;
	}
}